

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softmax.cpp
# Opt level: O3

int __thiscall ncnn::Softmax::forward_inplace(Softmax *this,Mat *bottom_top_blob,Option *opt)

{
  size_t __size;
  int *piVar1;
  int *piVar2;
  size_t sVar3;
  Allocator *pAVar4;
  size_t sVar5;
  size_t sVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  ulong uVar15;
  void *pvVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  size_t totalsize;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  void *pvVar23;
  ulong uVar24;
  void *pvVar25;
  float fVar26;
  float fVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  int remain;
  void *ptr;
  void *ptr_1;
  void *local_f8;
  void *local_f0;
  void *local_e8;
  undefined1 local_a8 [32];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  ulong local_60;
  void *local_58;
  void *local_50;
  int *local_48;
  long local_40;
  long local_38;
  
  uVar11 = bottom_top_blob->dims;
  if (uVar11 == 1) {
    iVar12 = bottom_top_blob->w;
    lVar20 = (long)iVar12;
    if (0 < lVar20) {
      pvVar16 = bottom_top_blob->data;
      fVar27 = -3.4028235e+38;
      lVar14 = 0;
      do {
        fVar30 = *(float *)((long)pvVar16 + lVar14 * 4);
        if (fVar27 <= fVar30) {
          fVar27 = fVar30;
        }
        lVar14 = lVar14 + 1;
      } while (lVar20 != lVar14);
      if (0 < iVar12) {
        fVar30 = 0.0;
        lVar14 = 0;
        do {
          fVar26 = expf(*(float *)((long)pvVar16 + lVar14 * 4) - fVar27);
          *(float *)((long)pvVar16 + lVar14 * 4) = fVar26;
          fVar30 = fVar30 + fVar26;
          lVar14 = lVar14 + 1;
        } while (lVar20 != lVar14);
        if (0 < iVar12) {
          lVar14 = 0;
          do {
            *(float *)((long)pvVar16 + lVar14 * 4) =
                 *(float *)((long)pvVar16 + lVar14 * 4) * (1.0 / fVar30);
            lVar14 = lVar14 + 1;
          } while (lVar20 != lVar14);
          return 0;
        }
      }
    }
LAB_00145b5f:
    iVar12 = 0;
  }
  else {
    sVar3 = bottom_top_blob->elemsize;
    uVar17 = this->axis;
    local_a8._16_8_ = sVar3;
    if ((uVar11 ^ 2) == 0 && uVar17 == 0) {
      uVar11 = bottom_top_blob->w;
      lVar20 = (long)(int)uVar11;
      uVar17 = bottom_top_blob->h;
      uVar15 = (ulong)uVar17;
      pAVar4 = opt->workspace_allocator;
      if (lVar20 != 0) {
        uVar21 = sVar3 * lVar20 + 3 & 0xfffffffffffffffc;
        if (pAVar4 == (Allocator *)0x0) {
          local_a8._0_8_ = (void *)0x0;
          iVar12 = posix_memalign((void **)local_a8,0x10,uVar21 + 4);
          local_e8 = (void *)0x0;
          if (iVar12 == 0) {
            local_e8 = (void *)local_a8._0_8_;
          }
        }
        else {
          local_e8 = (void *)(**(code **)(*(long *)pAVar4 + 0x10))();
        }
        uVar22 = (ulong)uVar11;
        piVar1 = (int *)(uVar21 + (long)local_e8);
        *(undefined4 *)((long)local_e8 + uVar21) = 1;
        auVar9 = _DAT_0016f120;
        auVar8 = _DAT_0016e020;
        auVar7 = _DAT_0016e010;
        if (0 < (int)uVar11) {
          lVar14 = uVar22 - 1;
          auVar28._8_4_ = (int)lVar14;
          auVar28._0_8_ = lVar14;
          auVar28._12_4_ = (int)((ulong)lVar14 >> 0x20);
          uVar18 = 0;
          auVar28 = auVar28 ^ _DAT_0016e020;
          do {
            auVar31._8_4_ = (int)uVar18;
            auVar31._0_8_ = uVar18;
            auVar31._12_4_ = (int)(uVar18 >> 0x20);
            auVar34 = (auVar31 | auVar7) ^ auVar8;
            iVar12 = auVar28._4_4_;
            if ((bool)(~(auVar34._4_4_ == iVar12 && auVar28._0_4_ < auVar34._0_4_ ||
                        iVar12 < auVar34._4_4_) & 1)) {
              *(undefined4 *)((long)local_e8 + uVar18 * 4) = 0xff7fffff;
            }
            if ((auVar34._12_4_ != auVar28._12_4_ || auVar34._8_4_ <= auVar28._8_4_) &&
                auVar34._12_4_ <= auVar28._12_4_) {
              *(undefined4 *)((long)local_e8 + uVar18 * 4 + 4) = 0xff7fffff;
            }
            auVar34 = (auVar31 | auVar9) ^ auVar8;
            iVar19 = auVar34._4_4_;
            if (iVar19 <= iVar12 && (iVar19 != iVar12 || auVar34._0_4_ <= auVar28._0_4_)) {
              *(undefined4 *)((long)local_e8 + uVar18 * 4 + 8) = 0xff7fffff;
              *(undefined4 *)((long)local_e8 + uVar18 * 4 + 0xc) = 0xff7fffff;
            }
            uVar18 = uVar18 + 4;
          } while ((uVar11 + 3 & 0xfffffffc) != uVar18);
        }
        if (0 < (int)uVar17) {
          pvVar16 = bottom_top_blob->data;
          iVar12 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar18 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar24 = 0;
              do {
                fVar30 = *(float *)((long)pvVar16 + uVar24 * 4);
                fVar27 = *(float *)((long)local_e8 + uVar24 * 4);
                if (fVar30 <= fVar27) {
                  fVar30 = fVar27;
                }
                *(float *)((long)local_e8 + uVar24 * 4) = fVar30;
                uVar24 = uVar24 + 1;
              } while (uVar22 != uVar24);
            }
            uVar18 = uVar18 + 1;
            pvVar16 = (void *)((long)pvVar16 + (long)iVar12 * sVar3);
          } while (uVar18 != uVar15);
        }
        local_88._0_8_ = opt->workspace_allocator;
        local_a8._0_8_ = (void *)0x0;
        local_a8._8_4_ = 0;
        local_a8._12_4_ = 0;
        local_a8._24_4_ = 1;
        local_88._8_4_ = 1;
        local_88._12_4_ = uVar11;
        local_78._8_8_ = lVar20;
        local_78._0_8_ = 0x100000001;
        if ((Allocator *)local_88._0_8_ == (Allocator *)0x0) {
          local_58 = (void *)0x0;
          iVar12 = posix_memalign(&local_58,0x10,uVar21 + 4);
          pvVar16 = (void *)0x0;
          if (iVar12 == 0) {
            pvVar16 = local_58;
          }
        }
        else {
          pvVar16 = (void *)(**(code **)(*(long *)local_88._0_8_ + 0x10))();
        }
        piVar2 = (int *)((long)pvVar16 + uVar21);
        *(undefined4 *)((long)pvVar16 + uVar21) = 1;
        local_a8._0_8_ = pvVar16;
        local_a8._8_8_ = piVar2;
        if (0 < (int)uVar11) {
          memset(pvVar16,0,uVar22 * 4);
        }
        if (0 < (int)uVar17) {
          pvVar23 = bottom_top_blob->data;
          iVar12 = bottom_top_blob->w;
          sVar3 = bottom_top_blob->elemsize;
          uVar21 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar18 = 0;
              do {
                fVar27 = expf(*(float *)((long)pvVar23 + uVar18 * 4) -
                              *(float *)((long)local_e8 + uVar18 * 4));
                *(float *)((long)pvVar23 + uVar18 * 4) = fVar27;
                *(float *)((long)pvVar16 + uVar18 * 4) =
                     fVar27 + *(float *)((long)pvVar16 + uVar18 * 4);
                uVar18 = uVar18 + 1;
              } while (uVar22 != uVar18);
            }
            uVar21 = uVar21 + 1;
            pvVar23 = (void *)((long)pvVar23 + (long)iVar12 * sVar3);
          } while (uVar21 != uVar15);
          if (0 < (int)uVar17) {
            pvVar23 = bottom_top_blob->data;
            iVar12 = bottom_top_blob->w;
            sVar3 = bottom_top_blob->elemsize;
            uVar21 = 0;
            do {
              if (0 < (int)uVar11) {
                uVar18 = 0;
                do {
                  *(float *)((long)pvVar23 + uVar18 * 4) =
                       *(float *)((long)pvVar23 + uVar18 * 4) /
                       *(float *)((long)pvVar16 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar22 != uVar18);
              }
              uVar21 = uVar21 + 1;
              pvVar23 = (void *)((long)pvVar23 + (long)iVar12 * sVar3);
            } while (uVar21 != uVar15);
          }
        }
        LOCK();
        *piVar2 = *piVar2 + -1;
        UNLOCK();
        if (*piVar2 == 0) {
          if ((Allocator *)local_88._0_8_ == (Allocator *)0x0) {
            if ((void *)local_a8._0_8_ != (void *)0x0) {
              free((void *)local_a8._0_8_);
            }
          }
          else {
            (**(code **)(*(long *)local_88._0_8_ + 0x18))();
          }
        }
        if (piVar1 == (int *)0x0) {
          return 0;
        }
        LOCK();
        *piVar1 = *piVar1 + -1;
        UNLOCK();
        if (*piVar1 != 0) {
          return 0;
        }
        if (pAVar4 != (Allocator *)0x0) {
          (**(code **)(*(long *)pAVar4 + 0x18))();
          return 0;
        }
LAB_001468ba:
        iVar13 = 0;
joined_r0x001468e2:
        if (local_e8 == (void *)0x0) {
          return iVar13;
        }
        free(local_e8);
        return iVar13;
      }
    }
    else {
      if ((uVar11 ^ 2) == 0 && (uVar17 ^ 1) == 0) {
        iVar12 = bottom_top_blob->h;
        if (0 < (long)iVar12) {
          uVar11 = bottom_top_blob->w;
          uVar15 = (ulong)uVar11;
          pvVar16 = bottom_top_blob->data;
          lVar20 = 0;
          do {
            if (0 < (int)uVar11) {
              uVar21 = 0;
              fVar27 = -3.4028235e+38;
              do {
                fVar30 = *(float *)((long)pvVar16 + uVar21 * 4);
                if (fVar27 <= fVar30) {
                  fVar27 = fVar30;
                }
                uVar21 = uVar21 + 1;
              } while (uVar15 != uVar21);
              if (0 < (int)uVar11) {
                fVar30 = 0.0;
                uVar21 = 0;
                do {
                  fVar26 = expf(*(float *)((long)pvVar16 + uVar21 * 4) - fVar27);
                  *(float *)((long)pvVar16 + uVar21 * 4) = fVar26;
                  fVar30 = fVar30 + fVar26;
                  uVar21 = uVar21 + 1;
                } while (uVar15 != uVar21);
                if (0 < (int)uVar11) {
                  uVar21 = 0;
                  do {
                    *(float *)((long)pvVar16 + uVar21 * 4) =
                         *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
                    uVar21 = uVar21 + 1;
                  } while (uVar15 != uVar21);
                }
              }
            }
            lVar20 = lVar20 + 1;
            pvVar16 = (void *)((long)pvVar16 + sVar3 * (long)(int)uVar11);
          } while (lVar20 != iVar12);
        }
        goto LAB_00145b5f;
      }
      uVar11 = uVar11 ^ 3;
      if (uVar11 == 0 && uVar17 == 0) {
        iVar12 = bottom_top_blob->w;
        iVar19 = bottom_top_blob->h;
        uVar11 = bottom_top_blob->c;
        uVar15 = (ulong)uVar11;
        uVar17 = iVar19 * iVar12;
        uVar21 = (ulong)uVar17;
        pAVar4 = opt->workspace_allocator;
        lVar20 = (long)(int)uVar17;
        if (uVar17 != 0) {
          uVar22 = sVar3 * lVar20 + 3 & 0xfffffffffffffffc;
          __size = uVar22 + 4;
          if (pAVar4 == (Allocator *)0x0) {
            local_a8._0_8_ = (void *)0x0;
            iVar13 = posix_memalign((void **)local_a8,0x10,__size);
            local_e8 = (void *)0x0;
            if (iVar13 == 0) {
              local_e8 = (void *)local_a8._0_8_;
            }
          }
          else {
            local_e8 = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,__size);
          }
          piVar1 = (int *)(uVar22 + (long)local_e8);
          *(undefined4 *)((long)local_e8 + uVar22) = 1;
          auVar9 = _DAT_0016f120;
          auVar8 = _DAT_0016e020;
          auVar7 = _DAT_0016e010;
          if (0 < (int)uVar17) {
            lVar14 = lVar20 + -1;
            auVar29._8_4_ = (int)lVar14;
            auVar29._0_8_ = lVar14;
            auVar29._12_4_ = (int)((ulong)lVar14 >> 0x20);
            uVar18 = 0;
            auVar29 = auVar29 ^ _DAT_0016e020;
            do {
              auVar32._8_4_ = (int)uVar18;
              auVar32._0_8_ = uVar18;
              auVar32._12_4_ = (int)(uVar18 >> 0x20);
              auVar34 = (auVar32 | auVar7) ^ auVar8;
              iVar13 = auVar29._4_4_;
              if ((bool)(~(auVar34._4_4_ == iVar13 && auVar29._0_4_ < auVar34._0_4_ ||
                          iVar13 < auVar34._4_4_) & 1)) {
                *(undefined4 *)((long)local_e8 + uVar18 * 4) = 0xff7fffff;
              }
              if ((auVar34._12_4_ != auVar29._12_4_ || auVar34._8_4_ <= auVar29._8_4_) &&
                  auVar34._12_4_ <= auVar29._12_4_) {
                *(undefined4 *)((long)local_e8 + uVar18 * 4 + 4) = 0xff7fffff;
              }
              auVar34 = (auVar32 | auVar9) ^ auVar8;
              iVar35 = auVar34._4_4_;
              if (iVar35 <= iVar13 && (iVar35 != iVar13 || auVar34._0_4_ <= auVar29._0_4_)) {
                *(undefined4 *)((long)local_e8 + uVar18 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_e8 + uVar18 * 4 + 0xc) = 0xff7fffff;
              }
              uVar18 = uVar18 + 4;
            } while ((uVar17 + 3 & 0xfffffffc) != uVar18);
          }
          if (0 < (int)uVar11) {
            sVar3 = bottom_top_blob->cstep;
            sVar5 = bottom_top_blob->elemsize;
            pvVar16 = bottom_top_blob->data;
            uVar18 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar24 = 0;
                do {
                  fVar30 = *(float *)((long)pvVar16 + uVar24 * 4);
                  fVar27 = *(float *)((long)local_e8 + uVar24 * 4);
                  if (fVar30 <= fVar27) {
                    fVar30 = fVar27;
                  }
                  *(float *)((long)local_e8 + uVar24 * 4) = fVar30;
                  uVar24 = uVar24 + 1;
                } while (uVar21 != uVar24);
              }
              uVar18 = uVar18 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar3 * sVar5);
            } while (uVar18 != uVar15);
          }
          local_88._0_8_ = opt->workspace_allocator;
          local_a8._0_8_ = (void *)0x0;
          local_a8._8_4_ = 0;
          local_a8._12_4_ = 0;
          local_a8._24_4_ = 1;
          local_88._8_4_ = 2;
          local_88._12_4_ = iVar12;
          local_78._4_4_ = 1;
          local_78._0_4_ = iVar19;
          local_78._8_8_ = lVar20;
          if ((Allocator *)local_88._0_8_ == (Allocator *)0x0) {
            local_58 = (void *)0x0;
            iVar12 = posix_memalign(&local_58,0x10,__size);
            local_a8._0_8_ = (void *)0x0;
            if (iVar12 == 0) {
              local_a8._0_8_ = local_58;
            }
          }
          else {
            local_a8._0_8_ = (**(code **)(*(long *)local_88._0_8_ + 0x10))();
          }
          piVar2 = (int *)(local_a8._0_8_ + uVar22);
          *(undefined4 *)(local_a8._0_8_ + uVar22) = 1;
          local_a8._8_8_ = piVar2;
          if (0 < (int)uVar17) {
            memset((void *)local_a8._0_8_,0,lVar20 << 2);
          }
          uVar10 = local_a8._0_8_;
          if (0 < (int)uVar11) {
            pvVar16 = bottom_top_blob->data;
            sVar3 = bottom_top_blob->cstep;
            sVar5 = bottom_top_blob->elemsize;
            uVar22 = 0;
            do {
              if (0 < (int)uVar17) {
                uVar18 = 0;
                do {
                  fVar27 = expf(*(float *)((long)pvVar16 + uVar18 * 4) -
                                *(float *)((long)local_e8 + uVar18 * 4));
                  *(float *)((long)pvVar16 + uVar18 * 4) = fVar27;
                  *(float *)(uVar10 + uVar18 * 4) = fVar27 + *(float *)(uVar10 + uVar18 * 4);
                  uVar18 = uVar18 + 1;
                } while (uVar21 != uVar18);
              }
              uVar22 = uVar22 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar3 * sVar5);
            } while (uVar22 != uVar15);
            if (0 < (int)uVar11) {
              pvVar16 = bottom_top_blob->data;
              sVar3 = bottom_top_blob->cstep;
              sVar5 = bottom_top_blob->elemsize;
              uVar22 = 0;
              do {
                if (0 < (int)uVar17) {
                  uVar18 = 0;
                  do {
                    *(float *)((long)pvVar16 + uVar18 * 4) =
                         *(float *)((long)pvVar16 + uVar18 * 4) /
                         *(float *)(local_a8._0_8_ + uVar18 * 4);
                    uVar18 = uVar18 + 1;
                  } while (uVar21 != uVar18);
                }
                uVar22 = uVar22 + 1;
                pvVar16 = (void *)((long)pvVar16 + sVar3 * sVar5);
              } while (uVar22 != uVar15);
            }
          }
          LOCK();
          *piVar2 = *piVar2 + -1;
          UNLOCK();
          if (*piVar2 == 0) {
            if ((Allocator *)local_88._0_8_ == (Allocator *)0x0) {
              if ((void *)local_a8._0_8_ != (void *)0x0) {
                free((void *)local_a8._0_8_);
              }
            }
            else {
              (**(code **)(*(long *)local_88._0_8_ + 0x18))();
            }
          }
          if (piVar1 == (int *)0x0) {
            return 0;
          }
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 != 0) {
            return 0;
          }
          if (pAVar4 != (Allocator *)0x0) {
            (**(code **)(*(long *)pAVar4 + 0x18))();
            return 0;
          }
          goto LAB_001468ba;
        }
      }
      else {
        if ((uVar17 ^ 1) != 0 || uVar11 != 0) {
          if (uVar11 != 0 || uVar17 != 2) {
            return 0;
          }
          iVar12 = bottom_top_blob->c;
          if ((long)iVar12 < 1) {
            return 0;
          }
          iVar19 = bottom_top_blob->h;
          uVar11 = bottom_top_blob->w;
          uVar15 = (ulong)uVar11;
          local_f8 = bottom_top_blob->data;
          sVar5 = bottom_top_blob->cstep;
          lVar20 = 0;
          do {
            if (0 < iVar19) {
              iVar13 = 0;
              pvVar16 = local_f8;
              do {
                if (0 < (int)uVar11) {
                  uVar21 = 0;
                  fVar27 = -3.4028235e+38;
                  do {
                    fVar30 = *(float *)((long)pvVar16 + uVar21 * 4);
                    if (fVar27 <= fVar30) {
                      fVar27 = fVar30;
                    }
                    uVar21 = uVar21 + 1;
                  } while (uVar15 != uVar21);
                  if (0 < (int)uVar11) {
                    fVar30 = 0.0;
                    uVar21 = 0;
                    do {
                      fVar26 = expf(*(float *)((long)pvVar16 + uVar21 * 4) - fVar27);
                      *(float *)((long)pvVar16 + uVar21 * 4) = fVar26;
                      fVar30 = fVar30 + fVar26;
                      uVar21 = uVar21 + 1;
                    } while (uVar15 != uVar21);
                    if (0 < (int)uVar11) {
                      uVar21 = 0;
                      do {
                        *(float *)((long)pvVar16 + uVar21 * 4) =
                             *(float *)((long)pvVar16 + uVar21 * 4) * (1.0 / fVar30);
                        uVar21 = uVar21 + 1;
                      } while (uVar15 != uVar21);
                    }
                  }
                }
                iVar13 = iVar13 + 1;
                pvVar16 = (void *)((long)pvVar16 + (long)(int)uVar11 * 4);
              } while (iVar13 != iVar19);
            }
            lVar20 = lVar20 + 1;
            local_f8 = (void *)((long)local_f8 + sVar3 * sVar5);
          } while (lVar20 != iVar12);
          return 0;
        }
        uVar11 = bottom_top_blob->w;
        uVar15 = (ulong)uVar11;
        iVar12 = bottom_top_blob->h;
        local_60 = (ulong)(uint)bottom_top_blob->c;
        pAVar4 = opt->workspace_allocator;
        iVar19 = bottom_top_blob->c * uVar11;
        if (iVar19 != 0) {
          uVar21 = sVar3 * (long)iVar19 + 3 & 0xfffffffffffffffc;
          if (pAVar4 == (Allocator *)0x0) {
            local_a8._0_8_ = (void *)0x0;
            iVar13 = posix_memalign((void **)local_a8,0x10,uVar21 + 4);
            local_e8 = (void *)0x0;
            if (iVar13 == 0) {
              local_e8 = (void *)local_a8._0_8_;
            }
          }
          else {
            local_e8 = (void *)(**(code **)(*(long *)pAVar4 + 0x10))(pAVar4,uVar21 + 4);
          }
          local_48 = (int *)((long)local_e8 + uVar21);
          *(undefined4 *)((long)local_e8 + uVar21) = 1;
          auVar9 = _DAT_0016f120;
          auVar8 = _DAT_0016e020;
          auVar7 = _DAT_0016e010;
          if (0 < iVar19) {
            lVar20 = (long)iVar19 + -1;
            auVar34._8_4_ = (int)lVar20;
            auVar34._0_8_ = lVar20;
            auVar34._12_4_ = (int)((ulong)lVar20 >> 0x20);
            uVar21 = 0;
            auVar34 = auVar34 ^ _DAT_0016e020;
            do {
              auVar33._8_4_ = (int)uVar21;
              auVar33._0_8_ = uVar21;
              auVar33._12_4_ = (int)(uVar21 >> 0x20);
              auVar29 = (auVar33 | auVar7) ^ auVar8;
              iVar13 = auVar34._4_4_;
              if ((bool)(~(auVar29._4_4_ == iVar13 && auVar34._0_4_ < auVar29._0_4_ ||
                          iVar13 < auVar29._4_4_) & 1)) {
                *(undefined4 *)((long)local_e8 + uVar21 * 4) = 0xff7fffff;
              }
              if ((auVar29._12_4_ != auVar34._12_4_ || auVar29._8_4_ <= auVar34._8_4_) &&
                  auVar29._12_4_ <= auVar34._12_4_) {
                *(undefined4 *)((long)local_e8 + uVar21 * 4 + 4) = 0xff7fffff;
              }
              auVar33 = (auVar33 | auVar9) ^ auVar8;
              iVar35 = auVar33._4_4_;
              if (iVar35 <= iVar13 && (iVar35 != iVar13 || auVar33._0_4_ <= auVar34._0_4_)) {
                *(undefined4 *)((long)local_e8 + uVar21 * 4 + 8) = 0xff7fffff;
                *(undefined4 *)((long)local_e8 + uVar21 * 4 + 0xc) = 0xff7fffff;
              }
              uVar21 = uVar21 + 4;
            } while ((iVar19 + 3U & 0xfffffffc) != uVar21);
          }
          lVar20 = (long)(int)uVar11;
          iVar19 = (int)local_60;
          if (0 < iVar19) {
            pvVar16 = bottom_top_blob->data;
            sVar5 = bottom_top_blob->cstep;
            sVar6 = bottom_top_blob->elemsize;
            uVar21 = 0;
            pvVar23 = local_e8;
            do {
              if (0 < iVar12) {
                iVar13 = 0;
                pvVar25 = pvVar16;
                do {
                  if (0 < (int)uVar11) {
                    uVar22 = 0;
                    do {
                      fVar30 = *(float *)((long)pvVar25 + uVar22 * 4);
                      fVar27 = *(float *)((long)pvVar23 + uVar22 * 4);
                      if (fVar30 <= fVar27) {
                        fVar30 = fVar27;
                      }
                      *(float *)((long)pvVar23 + uVar22 * 4) = fVar30;
                      uVar22 = uVar22 + 1;
                    } while (uVar15 != uVar22);
                  }
                  iVar13 = iVar13 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar20 * 4);
                } while (iVar13 != iVar12);
              }
              uVar21 = uVar21 + 1;
              pvVar16 = (void *)((long)pvVar16 + sVar5 * sVar6);
              pvVar23 = (void *)((long)pvVar23 + sVar3 * lVar20);
            } while (uVar21 != local_60);
          }
          local_a8._16_8_ = 0;
          local_a8._24_4_ = 0;
          local_a8._0_8_ = (void *)0x0;
          local_a8._8_4_ = 0;
          local_a8._12_4_ = 0;
          local_88 = (undefined1  [16])0x0;
          local_78 = (undefined1  [16])0x0;
          Mat::create((Mat *)local_a8,uVar11,iVar19,sVar3,opt->workspace_allocator);
          pvVar16 = (void *)local_a8._0_8_;
          iVar13 = -100;
          if ((void *)local_a8._0_8_ != (void *)0x0) {
            if (local_78._8_8_ * (long)(int)local_78._4_4_ != 0) {
              uVar17 = local_78._8_4_ * local_78._4_4_;
              if (0 < (int)uVar17) {
                memset((void *)local_a8._0_8_,0,(ulong)uVar17 << 2);
              }
              if (0 < iVar19) {
                local_f0 = bottom_top_blob->data;
                local_40 = (long)(int)local_88._12_4_ * local_a8._16_8_;
                local_38 = bottom_top_blob->cstep * bottom_top_blob->elemsize;
                uVar21 = 0;
                local_50 = pvVar16;
                pvVar23 = local_e8;
                do {
                  if (0 < iVar12) {
                    iVar19 = 0;
                    pvVar25 = local_f0;
                    do {
                      if (0 < (int)uVar11) {
                        uVar22 = 0;
                        do {
                          fVar27 = expf(*(float *)((long)pvVar25 + uVar22 * 4) -
                                        *(float *)((long)pvVar23 + uVar22 * 4));
                          *(float *)((long)pvVar25 + uVar22 * 4) = fVar27;
                          *(float *)((long)pvVar16 + uVar22 * 4) =
                               fVar27 + *(float *)((long)pvVar16 + uVar22 * 4);
                          uVar22 = uVar22 + 1;
                        } while (uVar15 != uVar22);
                      }
                      iVar19 = iVar19 + 1;
                      pvVar25 = (void *)((long)pvVar25 + lVar20 * 4);
                    } while (iVar19 != iVar12);
                  }
                  uVar21 = uVar21 + 1;
                  pvVar16 = (void *)((long)pvVar16 + local_40);
                  pvVar23 = (void *)((long)pvVar23 + sVar3 * lVar20);
                  local_f0 = (void *)((long)local_f0 + local_38);
                } while (uVar21 != local_60);
                if (0 < (int)local_60) {
                  pvVar16 = bottom_top_blob->data;
                  sVar3 = bottom_top_blob->cstep;
                  sVar5 = bottom_top_blob->elemsize;
                  uVar21 = 0;
                  pvVar23 = local_50;
                  do {
                    if (0 < iVar12) {
                      iVar19 = 0;
                      pvVar25 = pvVar16;
                      do {
                        if (0 < (int)uVar11) {
                          uVar22 = 0;
                          do {
                            *(float *)((long)pvVar25 + uVar22 * 4) =
                                 *(float *)((long)pvVar25 + uVar22 * 4) /
                                 *(float *)((long)pvVar23 + uVar22 * 4);
                            uVar22 = uVar22 + 1;
                          } while (uVar15 != uVar22);
                        }
                        iVar19 = iVar19 + 1;
                        pvVar25 = (void *)((long)pvVar25 + lVar20 * 4);
                      } while (iVar19 != iVar12);
                    }
                    uVar21 = uVar21 + 1;
                    pvVar16 = (void *)((long)pvVar16 + sVar3 * sVar5);
                    pvVar23 = (void *)((long)pvVar23 + (long)(int)local_88._12_4_ * local_a8._16_8_)
                    ;
                  } while (uVar21 != local_60);
                }
              }
              iVar13 = 0;
            }
          }
          Mat::~Mat((Mat *)local_a8);
          LOCK();
          *local_48 = *local_48 + -1;
          UNLOCK();
          if (*local_48 != 0) {
            return iVar13;
          }
          if (pAVar4 != (Allocator *)0x0) {
            (**(code **)(*(long *)pAVar4 + 0x18))();
            return iVar13;
          }
          goto joined_r0x001468e2;
        }
      }
    }
    iVar12 = -100;
  }
  return iVar12;
}

Assistant:

int Softmax::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    // value = exp( value - global max value )
    // sum all value
    // value = value / sum

    int dims = bottom_top_blob.dims;
    size_t elemsize = bottom_top_blob.elemsize;

    if (dims == 1) // axis == 0
    {
        int w = bottom_top_blob.w;

        float* ptr = bottom_top_blob;

        float max = -FLT_MAX;
        for (int i=0; i<w; i++)
        {
            max = std::max(max, ptr[i]);
        }

        float sum = 0.f;
        for (int i=0; i<w; i++)
        {
            ptr[i] = static_cast<float>(exp(ptr[i] - max));
            sum += ptr[i];
        }

        for (int i=0; i<w; i++)
        {
            ptr[i] /= sum;
        }

        return 0;
    }

    if (dims == 2 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        Mat max;
        max.create(w, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);

        for (int i=0; i<h; i++)
        {
            const float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                max[j] = std::max(max[j], ptr[j]);
            }
        }

        Mat sum;
        sum.create(w, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);

        for (int i = 0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - max[j]));
                sum[j] += ptr[j];
            }
        }

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            for (int j=0; j<w; j++)
            {
                ptr[j] /= sum[j];
            }
        }

        return 0;
    }

    if (dims == 2 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;

        for (int i=0; i<h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            float m = -FLT_MAX;
            for (int j=0; j<w; j++)
            {
                m = std::max(m, ptr[j]);
            }

            float s = 0.f;
            for (int j=0; j<w; j++)
            {
                ptr[j] = static_cast<float>(exp(ptr[j] - m));
                s += ptr[j];
            }

            for (int j=0; j<w; j++)
            {
                ptr[j] /= s;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 0)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;
        int size = w * h;

        Mat max;
        max.create(w, h, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                max[i] = std::max(max[i], ptr[i]);
            }
        }

        Mat sum;
        sum.create(w, h, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = static_cast<float>(exp(ptr[i] - max[i]));
                sum[i] += ptr[i];
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] /= sum[i];
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 1)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        Mat max;
        max.create(w, channels, elemsize, opt.workspace_allocator);
        if (max.empty())
            return -100;
        max.fill(-FLT_MAX);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    maxptr[j] = std::max(maxptr[j], ptr[j]);
                }

                ptr += w;
            }
        }

        Mat sum;
        sum.create(w, channels, elemsize, opt.workspace_allocator);
        if (sum.empty())
            return -100;
        sum.fill(0.f);
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* maxptr = max.row(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - maxptr[j]));
                    sumptr[j] += ptr[j];
                }

                ptr += w;
            }
        }

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            float* sumptr = sum.row(q);

            for (int i=0; i<h; i++)
            {
                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sumptr[j];
                }

                ptr += w;
            }
        }

        return 0;
    }

    if (dims == 3 && axis == 2)
    {
        int w = bottom_top_blob.w;
        int h = bottom_top_blob.h;
        int channels = bottom_top_blob.c;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<h; i++)
            {
                float max = -FLT_MAX;
                for (int j=0; j<w; j++)
                {
                    max = std::max(max, ptr[j]);
                }

                float sum = 0.f;
                for (int j=0; j<w; j++)
                {
                    ptr[j] = static_cast<float>(exp(ptr[j] - max));
                    sum += ptr[j];
                }

                for (int j=0; j<w; j++)
                {
                    ptr[j] /= sum;
                }

                ptr += w;
            }
        }

        return 0;
    }

    return 0;
}